

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::ItemAdd(ImRect *bb,ImGuiID id,ImRect *nav_bb_arg,ImGuiItemAddFlags flags)

{
  short *psVar1;
  ImGuiItemStatusFlags *pIVar2;
  ImRect *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  ImGuiNavLayer IVar9;
  uint uVar10;
  ImGuiWindow *window;
  ImGuiWindow *pIVar11;
  ImRect cand;
  ImRect cand_00;
  ImVec2 IVar12;
  ImGuiContext *pIVar13;
  bool bVar14;
  bool bVar15;
  ImGuiID IVar16;
  ImGui *this;
  ImGuiWindow *result;
  ImGuiNavItemData *result_00;
  ImGuiContext *g;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  
  pIVar13 = GImGui;
  window = GImGui->CurrentWindow;
  if (id == 0) goto LAB_00118559;
  IVar9 = (window->DC).NavLayerCurrent;
  psVar1 = &(window->DC).NavLayersActiveMaskNext;
  *psVar1 = *psVar1 | (ushort)(1 << ((byte)IVar9 & 0x1f));
  IVar16 = pIVar13->NavId;
  if ((IVar16 != id) && (pIVar13->NavAnyRequest != true)) goto LAB_00118559;
  pIVar11 = pIVar13->NavWindow;
  result = pIVar11->RootWindowForNav;
  if ((result != window->RootWindowForNav) ||
     ((window != pIVar11 && (((uint)(pIVar11->Flags | window->Flags) >> 0x17 & 1) == 0))))
  goto LAB_00118559;
  if (nav_bb_arg == (ImRect *)0x0) {
    nav_bb_arg = bb;
  }
  uVar10 = pIVar13->CurrentItemFlags;
  uVar7 = ((ImGuiNavItemData *)nav_bb_arg)->ID;
  uVar8 = ((ImGuiNavItemData *)nav_bb_arg)->FocusScopeId;
  fVar17 = (window->Pos).x;
  fVar21 = SUB84(((ImGuiNavItemData *)nav_bb_arg)->Window,0) - fVar17;
  fVar18 = (window->Pos).y;
  fVar22 = (float)((ulong)((ImGuiNavItemData *)nav_bb_arg)->Window >> 0x20) - fVar18;
  fVar17 = (float)uVar7 - fVar17;
  fVar18 = (float)uVar8 - fVar18;
  if ((pIVar13->NavInitRequest == true) && (pIVar13->NavLayer == IVar9)) {
    if ((uVar10 & 0x10) == 0) {
      pIVar13->NavInitResultId = id;
      (pIVar13->NavInitResultRectRel).Min.x = fVar21;
      (pIVar13->NavInitResultRectRel).Min.y = fVar22;
      (pIVar13->NavInitResultRectRel).Max.x = fVar17;
      (pIVar13->NavInitResultRectRel).Max.y = fVar18;
      pIVar13->NavInitRequest = false;
      NavUpdateAnyRequestFlag();
      IVar16 = pIVar13->NavId;
    }
    else if (pIVar13->NavInitResultId == 0) {
      pIVar13->NavInitResultId = id;
      (pIVar13->NavInitResultRectRel).Min.x = fVar21;
      (pIVar13->NavInitResultRectRel).Min.y = fVar22;
      (pIVar13->NavInitResultRectRel).Max.x = fVar17;
      (pIVar13->NavInitResultRectRel).Max.y = fVar18;
    }
  }
  if (IVar16 == id) {
    if (((byte)pIVar13->NavMoveRequestFlags >> 4 & (uVar10 & 0xc) == 0) != 0) {
LAB_00118698:
      this = (ImGui *)&pIVar13->NavMoveResultOther;
      if (pIVar13->NavWindow == window) {
        this = (ImGui *)&pIVar13->NavMoveResultLocal;
      }
      if ((pIVar13->NavMoveRequest == true) &&
         (cand.Min = (ImVec2)((ImGuiNavItemData *)nav_bb_arg)->Window,
         cand.Max.x = (float)((ImGuiNavItemData *)nav_bb_arg)->ID,
         cand.Max.y = (float)((ImGuiNavItemData *)nav_bb_arg)->FocusScopeId,
         bVar14 = NavScoreItem(this,(ImGuiNavItemData *)result,cand), bVar14)) {
        *(ImGuiWindow **)this = window;
        *(ImGuiID *)(this + 8) = id;
        *(ImGuiID *)(this + 0xc) = (window->DC).NavFocusScopeIdCurrent;
        *(float *)(this + 0x10) = fVar21;
        *(float *)(this + 0x14) = fVar22;
        *(float *)(this + 0x18) = fVar17;
        *(float *)(this + 0x1c) = fVar18;
      }
      if (((pIVar13->NavMoveRequestFlags & 0x20) != 0) &&
         (result_00 = (ImGuiNavItemData *)nav_bb_arg,
         bVar14 = ImRect::Overlaps(&window->ClipRect,nav_bb_arg), bVar14)) {
        fVar4 = *(float *)((long)&((ImGuiNavItemData *)nav_bb_arg)->Window + 4);
        fVar5 = (float)((ImGuiNavItemData *)nav_bb_arg)->FocusScopeId;
        fVar6 = (window->ClipRect).Min.y;
        fVar19 = (window->ClipRect).Max.y;
        fVar20 = fVar19;
        if (fVar5 <= fVar19) {
          fVar20 = fVar5;
        }
        if (fVar4 <= fVar19) {
          fVar19 = fVar4;
        }
        if (((fVar5 - fVar4) * 0.7 <=
             (float)(-(uint)(fVar5 < fVar6) & (uint)fVar6 | ~-(uint)(fVar5 < fVar6) & (uint)fVar20)
             - (float)(-(uint)(fVar4 < fVar6) & (uint)fVar6 | ~-(uint)(fVar4 < fVar6) & (uint)fVar19
                      )) &&
           (cand_00.Min = (ImVec2)((ImGuiNavItemData *)nav_bb_arg)->Window,
           cand_00.Max.x = (float)((ImGuiNavItemData *)nav_bb_arg)->ID,
           cand_00.Max.y = (float)((ImGuiNavItemData *)nav_bb_arg)->FocusScopeId,
           bVar14 = NavScoreItem((ImGui *)&pIVar13->NavMoveResultLocalVisibleSet,result_00,cand_00),
           bVar14)) {
          (pIVar13->NavMoveResultLocalVisibleSet).Window = window;
          (pIVar13->NavMoveResultLocalVisibleSet).ID = id;
          (pIVar13->NavMoveResultLocalVisibleSet).FocusScopeId = (window->DC).NavFocusScopeIdCurrent
          ;
          (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Min.x = fVar21;
          (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Min.y = fVar22;
          (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Max.x = fVar17;
          (pIVar13->NavMoveResultLocalVisibleSet).RectRel.Max.y = fVar18;
        }
      }
    }
  }
  else if ((uVar10 & 0xc) == 0) goto LAB_00118698;
  if (pIVar13->NavId == id) {
    pIVar13->NavWindow = window;
    IVar9 = (window->DC).NavLayerCurrent;
    pIVar13->NavLayer = IVar9;
    pIVar13->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
    pIVar13->NavIdIsAlive = true;
    pIVar3 = window->NavRectRel + IVar9;
    (pIVar3->Min).x = fVar21;
    (pIVar3->Min).y = fVar22;
    (pIVar3->Max).x = fVar17;
    (pIVar3->Max).y = fVar18;
  }
LAB_00118559:
  (window->DC).LastItemId = id;
  IVar12 = bb->Max;
  (window->DC).LastItemRect.Min = bb->Min;
  (window->DC).LastItemRect.Max = IVar12;
  (window->DC).LastItemStatusFlags = 0;
  (pIVar13->NextItemData).Flags = 0;
  bVar14 = IsClippedEx(bb,id,false);
  if (!bVar14) {
    if ((flags & 1U) != 0) {
      ItemFocusable(window,id);
    }
    bVar15 = IsMouseHoveringRect(&bb->Min,&bb->Max,true);
    if (bVar15) {
      pIVar2 = &(window->DC).LastItemStatusFlags;
      *(byte *)pIVar2 = (byte)*pIVar2 | 1;
    }
  }
  return !bVar14;
}

Assistant:

bool ImGui::ItemAdd(const ImRect& bb, ImGuiID id, const ImRect* nav_bb_arg, ImGuiItemAddFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (id != 0)
    {
        // Navigation processing runs prior to clipping early-out
        //  (a) So that NavInitRequest can be honored, for newly opened windows to select a default widget
        //  (b) So that we can scroll up/down past clipped items. This adds a small O(N) cost to regular navigation requests
        //      unfortunately, but it is still limited to one window. It may not scale very well for windows with ten of
        //      thousands of item, but at least NavMoveRequest is only set on user interaction, aka maximum once a frame.
        //      We could early out with "if (is_clipped && !g.NavInitRequest) return false;" but when we wouldn't be able
        //      to reach unclipped widgets. This would work if user had explicit scrolling control (e.g. mapped on a stick).
        // We intentionally don't check if g.NavWindow != NULL because g.NavAnyRequest should only be set when it is non null.
        // If we crash on a NULL g.NavWindow we need to fix the bug elsewhere.
        window->DC.NavLayersActiveMaskNext |= (1 << window->DC.NavLayerCurrent);
        if (g.NavId == id || g.NavAnyRequest)
            if (g.NavWindow->RootWindowForNav == window->RootWindowForNav)
                if (window == g.NavWindow || ((window->Flags | g.NavWindow->Flags) & ImGuiWindowFlags_NavFlattened))
                    NavProcessItem(window, nav_bb_arg ? *nav_bb_arg : bb, id);

        // [DEBUG] Item Picker tool, when enabling the "extended" version we perform the check in ItemAdd()
#ifdef IMGUI_DEBUG_TOOL_ITEM_PICKER_EX
        if (id == g.DebugItemPickerBreakId)
        {
            IM_DEBUG_BREAK();
            g.DebugItemPickerBreakId = 0;
        }
#endif
    }

    // Equivalent to calling SetLastItemData()
    window->DC.LastItemId = id;
    window->DC.LastItemRect = bb;
    window->DC.LastItemStatusFlags = ImGuiItemStatusFlags_None;
    g.NextItemData.Flags = ImGuiNextItemDataFlags_None;

#ifdef IMGUI_ENABLE_TEST_ENGINE
    if (id != 0)
        IMGUI_TEST_ENGINE_ITEM_ADD(nav_bb_arg ? *nav_bb_arg : bb, id);
#endif

    // Clipping test
    const bool is_clipped = IsClippedEx(bb, id, false);
    if (is_clipped)
        return false;
    //if (g.IO.KeyAlt) window->DrawList->AddRect(bb.Min, bb.Max, IM_COL32(255,255,0,120)); // [DEBUG]

    // Tab stop handling (previously was using internal ItemFocusable() api)
    // FIXME-NAV: We would now want to move this above the clipping test, but this would require being able to scroll and currently this would mean an extra frame. (#4079, #343)
    if (flags & ImGuiItemAddFlags_Focusable)
        ItemFocusable(window, id);

    // We need to calculate this now to take account of the current clipping rectangle (as items like Selectable may change them)
    if (IsMouseHoveringRect(bb.Min, bb.Max))
        window->DC.LastItemStatusFlags |= ImGuiItemStatusFlags_HoveredRect;
    return true;
}